

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::MapCallSiteToCallApplyCallSiteMap(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  unsigned_short uVar1;
  ushort uVar2;
  int iVar3;
  CallSiteToCallApplyCallSiteMap *pCVar4;
  Type pSVar5;
  uint uVar6;
  FunctionBody *this_00;
  ProfileId *pPVar7;
  void *pvVar8;
  ulong uVar9;
  int iVar10;
  
  this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
  pPVar7 = Js::FunctionBody::CreateCallSiteToCallApplyCallSiteArray(this_00);
  if (pPVar7 != (ProfileId *)0x0) {
    pCVar4 = funcInfo->callSiteToCallApplyCallSiteMap;
    uVar6 = pCVar4->bucketCount;
    if (uVar6 != 0) {
      uVar9 = 0;
      do {
        iVar10 = pCVar4->buckets[uVar9];
        if (iVar10 != -1) {
          do {
            pSVar5 = pCVar4->entries;
            iVar3 = pSVar5[iVar10].
                    super_DefaultHashedEntry<unsigned_short,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_short,_unsigned_short>.
                    super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>_>
                    .super_KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>.next;
            uVar1 = pSVar5[iVar10].
                    super_DefaultHashedEntry<unsigned_short,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_short,_unsigned_short>.
                    super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>_>
                    .super_KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>.value;
            uVar2 = pSVar5[iVar10].
                    super_DefaultHashedEntry<unsigned_short,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_short,_unsigned_short>.
                    super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>_>
                    .super_KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>.key;
            pvVar8 = Js::FunctionProxy::GetAuxPtr
                               ((FunctionProxy *)this_00,CallSiteToCallApplyCallSiteArray);
            *(unsigned_short *)((long)pvVar8 + (ulong)uVar2 * 2) = uVar1;
            iVar10 = iVar3;
          } while (iVar3 != -1);
          uVar6 = pCVar4->bucketCount;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar6);
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::MapCallSiteToCallApplyCallSiteMap(FuncInfo * funcInfo)
{
    Js::FunctionBody * functionBody = funcInfo->GetParsedFunctionBody();
    
    if (functionBody->CreateCallSiteToCallApplyCallSiteArray())
    {
        funcInfo->callSiteToCallApplyCallSiteMap->Map([functionBody](Js::ProfileId callSiteId, Js::ProfileId callApplyCallSiteId)
        {
            functionBody->GetCallSiteToCallApplyCallSiteArray()[callSiteId] = callApplyCallSiteId;
        });
    }
}